

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.cpp
# Opt level: O0

void __thiscall aeron::ExclusivePublication::~ExclusivePublication(ExclusivePublication *this)

{
  undefined8 *in_RDI;
  int64_t in_stack_00000048;
  ClientConductor *in_stack_00000050;
  unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  *this_00;
  unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  *local_18;
  
  *in_RDI = &PTR__ExclusivePublication_00227c90;
  ClientConductor::releaseExclusivePublication(in_stack_00000050,in_stack_00000048);
  this_00 = (unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
             *)(in_RDI + 0x17);
  local_18 = (unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
              *)(in_RDI + 0x1a);
  do {
    local_18 = local_18 + -1;
    std::
    unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
    ::~unique_ptr(this_00);
  } while (local_18 != this_00);
  std::shared_ptr<aeron::LogBuffers>::~shared_ptr((shared_ptr<aeron::LogBuffers> *)0x1ec0df);
  concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
  ~ReadablePosition((ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition> *)0x1ec0f0);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  return;
}

Assistant:

ExclusivePublication::~ExclusivePublication()
{
    m_conductor.releaseExclusivePublication(m_registrationId);
}